

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

Option * __thiscall CLI::App::get_option(App *this,string *name)

{
  pointer puVar1;
  Option *this_00;
  pointer pcVar2;
  bool bVar3;
  OptionNotFound *this_01;
  pointer puVar4;
  bool bVar5;
  Option *local_80;
  string local_70;
  string local_50;
  
  puVar4 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = puVar4 == puVar1;
  if (!bVar5) {
    do {
      this_00 = (puVar4->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      pcVar2 = (name->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + name->_M_string_length);
      bVar3 = Option::check_name(this_00,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        local_80 = (puVar4->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        break;
      }
      puVar4 = puVar4 + 1;
      bVar5 = puVar4 == puVar1;
    } while (!bVar5);
  }
  if (!bVar5) {
    return local_80;
  }
  this_01 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
  OptionNotFound::OptionNotFound(this_01,&local_50);
  __cxa_throw(this_01,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

Option *get_option(std::string name) {
        for(Option_p &opt : options_) {
            if(opt->check_name(name)) {
                return opt.get();
            }
        }
        throw OptionNotFound(name);
    }